

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall
tetgenmesh::tetallnormal
          (tetgenmesh *this,point pa,point pb,point pc,point pd,double (*N) [3],double *volume)

{
  bool bVar1;
  int local_100;
  int local_fc;
  int j;
  int i;
  int indx [4];
  double local_e0;
  double D;
  double rhs [4];
  double A [4] [4];
  double (*N_local) [3];
  point pd_local;
  point pc_local;
  point pb_local;
  point pa_local;
  tetgenmesh *this_local;
  
  for (local_fc = 0; local_fc < 3; local_fc = local_fc + 1) {
    rhs[(long)local_fc + 3] = pa[local_fc] - pd[local_fc];
  }
  for (local_fc = 0; local_fc < 3; local_fc = local_fc + 1) {
    A[0][(long)local_fc + 3] = pb[local_fc] - pd[local_fc];
  }
  for (local_fc = 0; local_fc < 3; local_fc = local_fc + 1) {
    A[1][(long)local_fc + 3] = pc[local_fc] - pd[local_fc];
  }
  A[3][3] = (double)N;
  bVar1 = lu_decmp(this,(double (*) [4])(rhs + 3),3,&j,&local_e0,0);
  if (bVar1) {
    if (volume != (double *)0x0) {
      *volume = ABS(A[(long)j + -1][3] * A[i][0] * A[indx[0]][1]) / 6.0;
    }
    for (local_100 = 0; local_100 < 3; local_100 = local_100 + 1) {
      for (local_fc = 0; local_fc < 3; local_fc = local_fc + 1) {
        rhs[(long)local_fc + -1] = 0.0;
      }
      rhs[(long)local_100 + -1] = 1.0;
      lu_solve(this,(double (*) [4])(rhs + 3),3,&j,&D,0);
      for (local_fc = 0; local_fc < 3; local_fc = local_fc + 1) {
        *(double *)((long)A[3][3] + (long)local_100 * 0x18 + (long)local_fc * 8) =
             rhs[(long)local_fc + -1];
      }
    }
    for (local_fc = 0; local_fc < 3; local_fc = local_fc + 1) {
      *(double *)((long)A[3][3] + 0x48 + (long)local_fc * 8) =
           (-*(double *)((long)A[3][3] + (long)local_fc * 8) -
           *(double *)((long)A[3][3] + 0x18 + (long)local_fc * 8)) -
           *(double *)((long)A[3][3] + 0x30 + (long)local_fc * 8);
    }
  }
  else if (volume != (double *)0x0) {
    *volume = 0.0;
  }
  return;
}

Assistant:

void tetgenmesh::tetallnormal(point pa, point pb, point pc, point pd,
                              REAL N[4][3], REAL* volume)
{
  REAL A[4][4], rhs[4], D;
  int indx[4];
  int i, j;

  // get the entries of A[3][3].
  for (i = 0; i < 3; i++) A[0][i] = pa[i] - pd[i];  // d->a vec
  for (i = 0; i < 3; i++) A[1][i] = pb[i] - pd[i];  // d->b vec
  for (i = 0; i < 3; i++) A[2][i] = pc[i] - pd[i];  // d->c vec

  // Compute the inverse of matrix A, to get 3 normals of the 4 faces.
  if (lu_decmp(A, 3, indx, &D, 0)) { // Decompose the matrix just once.
    if (volume != NULL) {
      // Get the volume of the tet.
      *volume = fabs((A[indx[0]][0] * A[indx[1]][1] * A[indx[2]][2])) / 6.0;
    }
    for (j = 0; j < 3; j++) {
      for (i = 0; i < 3; i++) rhs[i] = 0.0;
      rhs[j] = 1.0;  // Positive means the inside direction
      lu_solve(A, 3, indx, rhs, 0);
      for (i = 0; i < 3; i++) N[j][i] = rhs[i];
    }
    // Get the fourth normal by summing up the first three.
    for (i = 0; i < 3; i++) N[3][i] = - N[0][i] - N[1][i] - N[2][i];
  } else {
    // The tet is degenerated.
    if (volume != NULL) {
      *volume = 0;
    }
  }
}